

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
emplace_helper<QtGraphicsAnchorLayout::GraphPath>
          (iterator *__return_storage_ptr__,
          QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
          *this,AnchorVertex **key,GraphPath *args)

{
  byte bVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 *puVar8;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::
  Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
  ::findOrInsert<QtGraphicsAnchorLayout::AnchorVertex*>
            ((InsertionResult *)local_58,
             (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
              *)this->d,key);
  pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
          [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    puVar8 = (undefined4 *)operator_new(0x18);
    uVar4 = *(undefined4 *)&(args->positives).q_hash.d;
    uVar5 = *(undefined4 *)((long)&(args->positives).q_hash.d + 4);
    uVar6 = *(undefined4 *)&(args->negatives).q_hash.d;
    uVar7 = *(undefined4 *)((long)&(args->negatives).q_hash.d + 4);
    (args->positives).q_hash.d = (Data *)0x0;
    (args->negatives).q_hash.d = (Data *)0x0;
    *puVar8 = uVar4;
    puVar8[1] = uVar5;
    puVar8[2] = uVar6;
    puVar8[3] = uVar7;
    *(undefined8 *)(puVar8 + 4) = 0;
    *(AnchorVertex **)pEVar2[bVar1].storage.data = *key;
    *(undefined4 **)(pEVar2[bVar1].storage.data + 8) = puVar8;
  }
  else {
    puVar8 = (undefined4 *)operator_new(0x18);
    uVar4 = *(undefined4 *)&(args->positives).q_hash.d;
    uVar5 = *(undefined4 *)((long)&(args->positives).q_hash.d + 4);
    uVar6 = *(undefined4 *)&(args->negatives).q_hash.d;
    uVar7 = *(undefined4 *)((long)&(args->negatives).q_hash.d + 4);
    (args->positives).q_hash.d = (Data *)0x0;
    (args->negatives).q_hash.d = (Data *)0x0;
    *puVar8 = uVar4;
    puVar8[1] = uVar5;
    puVar8[2] = uVar6;
    puVar8[3] = uVar7;
    *(undefined8 *)(puVar8 + 4) = 0;
    uVar3 = *(undefined8 *)(pEVar2[bVar1].storage.data + 8);
    *(undefined4 **)(pEVar2[bVar1].storage.data + 8) = puVar8;
    *(undefined8 *)(puVar8 + 4) = uVar3;
  }
  this->m_size = this->m_size + 1;
  (__return_storage_ptr__->i).d =
       (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
        *)local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
       *)local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
       *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }